

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ConvertNodeToPolicyAndAddToSolution
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,
          double value)

{
  Index IVar1;
  size_t sVar2;
  type pJVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  shared_ptr<BGIP_BnB_Node> *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  Index depth_tI;
  Index acI;
  Index tI;
  Index agI;
  shared_ptr<JointPolicyPureVector> jpol;
  Index in_stack_00000100;
  Index in_stack_00000104;
  BGIP_BnB_Node *in_stack_00000108;
  Index in_stack_ffffffffffffff38;
  Index in_stack_ffffffffffffff3c;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff40;
  shared_ptr<JointPolicyDiscretePure> *in_stack_ffffffffffffff58;
  uint local_40;
  uint local_3c;
  undefined1 local_38 [16];
  shared_ptr<JointPolicyPureVector> local_28;
  double local_18;
  
  local_18 = in_XMM0_Qa;
  (**(code **)(*in_RDI + 0x38))(local_38);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            (in_stack_ffffffffffffff58);
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x13a9c2);
  for (local_3c = 0; (ulong)local_3c != in_RDI[0x3b]; local_3c = local_3c + 1) {
    local_40 = 0;
    while( true ) {
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x25));
      sVar2 = BayesianGameBase::GetNrTypes
                        ((BayesianGameBase *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      if (local_40 == sVar2) break;
      boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
                ((shared_ptr<BGIP_BnB_Node> *)in_stack_ffffffffffffff40,
                 (shared_ptr<BGIP_BnB_Node> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      GetDepthFirstSpecified
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                 (BGIP_BnB_NodePtr *)0x13aa78);
      boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x13aa86);
      boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RSI);
      IVar1 = BGIP_BnB_Node::GetSpecifiedAction
                        (in_stack_00000108,in_stack_00000104,in_stack_00000100);
      pJVar3 = boost::shared_ptr<JointPolicyPureVector>::operator->(&local_28);
      (**(code **)(*(long *)pJVar3 + 0x80))(pJVar3,local_3c,local_40,IVar1);
      local_40 = local_40 + 1;
    }
  }
  boost::shared_ptr<JointPolicyPureVector>::operator*(&local_28);
  BayesianGameIdenticalPayoffSolver::AddSolution
            ((BayesianGameIdenticalPayoffSolver *)in_stack_ffffffffffffff40,
             (JointPolicyPureVector *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             6.36877791099888e-318);
  if (0 < (int)in_RDI[0x22]) {
    std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound added solution ");
    pbVar4 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffff40,
                               (shared_ptr<JointPolicyPureVector> *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    poVar5 = std::operator<<((ostream *)pbVar4," with value ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
            ((shared_ptr<JointPolicyPureVector> *)0x13abf6);
  return;
}

Assistant:

void ConvertNodeToPolicyAndAddToSolution(BGIP_BnB_NodePtr node, double value)
    {
        boost::shared_ptr<JP> jpol =  boost::dynamic_pointer_cast<JP>( this->GetNewJpol() );
        for(Index agI=0;agI!=_m_nrAgents;++agI)
            for(Index tI=0;tI!=_m_bgip->GetNrTypes(agI);++tI)
            {
                Index acI;
#if MAINTAIN_FULL_POL        
                acI = node->GetAction(agI,tI);
#else
#if 0 //CACHE_IMPLIED_JPOL
          // NO, this is not correct, because
          //_m_impliedJPol is not related to the particular node we are
          //computing this for
                acI = _m_impliedJPol[agI][tI];
#else          
                Index depth_tI = GetDepthFirstSpecified(agI,tI,node);
                acI = node->GetSpecifiedAction(agI, depth_tI);
#endif
#endif
                jpol->SetAction(agI,tI,acI);
            }
        this->
            AddSolution(*jpol, value);
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound added solution " << jpol
                      << " with value " << value << std::endl;
    }